

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O0

gnode_t * gnode_block_stat_create
                    (gnode_n type,gtoken_s token,gnode_r *stmts,gnode_t *decl,uint32_t block_length)

{
  gnode_t *pgVar1;
  gnode_compound_stmt_t *node;
  uint32_t block_length_local;
  gnode_t *decl_local;
  gnode_r *stmts_local;
  gnode_n type_local;
  
  pgVar1 = (gnode_t *)gravity_calloc((gravity_vm *)0x0,1,0x60);
  pgVar1->tag = type;
  memcpy(&pgVar1->token,&token,0x28);
  pgVar1->decl = decl;
  pgVar1->block_length = block_length;
  *(gnode_r **)&pgVar1[1].block_length = stmts;
  pgVar1[1].token.type = ~TOK_EOF;
  return pgVar1;
}

Assistant:

gnode_t *gnode_block_stat_create (gnode_n type, gtoken_s token, gnode_r *stmts, gnode_t *decl, uint32_t block_length) {
    gnode_compound_stmt_t *node = (gnode_compound_stmt_t *)mem_alloc(NULL, sizeof(gnode_compound_stmt_t));

    SETBASE(node, type, token);
    SETDECL(node, decl);
	node->base.block_length = block_length;
    node->stmts = stmts;
    node->nclose = UINT32_MAX;
    return (gnode_t *)node;
}